

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8proc.cpp
# Opt level: O1

utf8proc_ssize_t
duckdb::utf8proc_map_custom
          (utf8proc_uint8_t *str,utf8proc_ssize_t strlen,utf8proc_uint8_t **dstptr,
          utf8proc_option_t options,utf8proc_custom_func custom_func,void *custom_data)

{
  utf8proc_ssize_t bufsize;
  utf8proc_int32_t *buffer;
  utf8proc_int32_t *puVar1;
  
  *dstptr = (utf8proc_uint8_t *)0x0;
  bufsize = utf8proc_decompose_custom
                      (str,strlen,(utf8proc_int32_t *)0x0,0,options,custom_func,custom_data);
  if (-1 < bufsize) {
    buffer = (utf8proc_int32_t *)malloc(bufsize * 4 + 1);
    if (buffer == (utf8proc_int32_t *)0x0) {
      bufsize = -1;
    }
    else {
      bufsize = utf8proc_decompose_custom(str,strlen,buffer,bufsize,options,custom_func,custom_data)
      ;
      if ((-1 < bufsize) && (bufsize = utf8proc_reencode(buffer,bufsize,options), -1 < bufsize)) {
        puVar1 = (utf8proc_int32_t *)realloc(buffer,bufsize + 1);
        if (puVar1 != (utf8proc_int32_t *)0x0) {
          buffer = puVar1;
        }
        *dstptr = (utf8proc_uint8_t *)buffer;
        return bufsize;
      }
      free(buffer);
    }
  }
  return bufsize;
}

Assistant:

UTF8PROC_DLLEXPORT utf8proc_ssize_t utf8proc_map_custom(
  const utf8proc_uint8_t *str, utf8proc_ssize_t strlen, utf8proc_uint8_t **dstptr, utf8proc_option_t options,
  utf8proc_custom_func custom_func, void *custom_data
) {
  utf8proc_int32_t *buffer;
  utf8proc_ssize_t result;
  *dstptr = NULL;
  result = utf8proc_decompose_custom(str, strlen, NULL, 0, options, custom_func, custom_data);
  if (result < 0) return result;
  buffer = (utf8proc_int32_t *) malloc(((utf8proc_size_t)result) * sizeof(utf8proc_int32_t) + 1);
  if (!buffer) return UTF8PROC_ERROR_NOMEM;
  result = utf8proc_decompose_custom(str, strlen, buffer, result, options, custom_func, custom_data);
  if (result < 0) {
    free(buffer);
    return result;
  }
  result = utf8proc_reencode(buffer, result, options);
  if (result < 0) {
    free(buffer);
    return result;
  }
  {
    utf8proc_int32_t *newptr;
    newptr = (utf8proc_int32_t *) realloc(buffer, (size_t)result+1);
    if (newptr) buffer = newptr;
  }
  *dstptr = (utf8proc_uint8_t *)buffer;
  return result;
}